

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<ot::commissioner::State_()> * __thiscall
testing::internal::TypedExpectation<ot::commissioner::State_()>::Times
          (TypedExpectation<ot::commissioner::State_()> *this,int n)

{
  TypedExpectation<ot::commissioner::State_()> *pTVar1;
  Cardinality local_28;
  int local_14;
  TypedExpectation<ot::commissioner::State_()> *pTStack_10;
  int n_local;
  TypedExpectation<ot::commissioner::State_()> *this_local;
  
  local_14 = n;
  pTStack_10 = this;
  Exactly((testing *)&local_28,n);
  pTVar1 = Times(this,&local_28);
  Cardinality::~Cardinality(&local_28);
  return pTVar1;
}

Assistant:

TypedExpectation& Times(int n) {
    return Times(Exactly(n));
  }